

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O2

string * __thiscall
AssemblyCode::MoveMemFromRegPlusConstToReg::ToString_abi_cxx11_
          (string *__return_storage_ptr__,MoveMemFromRegPlusConstToReg *this)

{
  int iVar1;
  int __val;
  string sStack_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  if (this->constant < 1) {
    IRT::CTemp::ToString_abi_cxx11_(&local_38,&this->target);
    std::operator+(&local_d8,"mov ",&local_38);
    std::operator+(&local_b8,&local_d8," [");
    IRT::CTemp::ToString_abi_cxx11_(&local_f8,&this->source);
    std::operator+(&local_98,&local_b8,&local_f8);
    std::operator+(&local_78,&local_98," - ");
    iVar1 = this->constant;
    __val = -iVar1;
    if (0 < iVar1) {
      __val = iVar1;
    }
    std::__cxx11::to_string(&sStack_118,__val);
    std::operator+(&local_58,&local_78,&sStack_118);
    std::operator+(__return_storage_ptr__,&local_58,"]\n");
  }
  else {
    IRT::CTemp::ToString_abi_cxx11_(&local_38,&this->target);
    std::operator+(&local_d8,"mov ",&local_38);
    std::operator+(&local_b8,&local_d8," [");
    IRT::CTemp::ToString_abi_cxx11_(&local_f8,&this->source);
    std::operator+(&local_98,&local_b8,&local_f8);
    std::operator+(&local_78,&local_98," + ");
    std::__cxx11::to_string(&sStack_118,this->constant);
    std::operator+(&local_58,&local_78,&sStack_118);
    std::operator+(__return_storage_ptr__,&local_58,"]\n");
  }
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&sStack_118);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string AssemblyCode::MoveMemFromRegPlusConstToReg::ToString( ) const {
    if (constant > 0) {
        return "mov " + target.ToString( ) + " [" + source.ToString( ) + " + " + std::to_string( constant ) + "]\n";
    } else {
        return "mov " + target.ToString( ) + " [" + source.ToString( ) + " - " + std::to_string( abs(constant) ) + "]\n";
    }
}